

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddVisibilityPresetFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang)

{
  cmake *this_00;
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  int iVar5;
  char *pcVar6;
  char *__s1;
  string *psVar7;
  ostream *poVar8;
  string *psVar9;
  cmLocalGenerator *pcVar10;
  PolicyID id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar11;
  cmGeneratorTarget *target_local;
  allocator local_271;
  string *local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string l;
  string compileOption;
  string warnCMP0063;
  string flagDefine;
  string option;
  
  if (lang->_M_string_length == 0) {
    return;
  }
  warnCMP0063._M_dataplus._M_p = (pointer)&warnCMP0063.field_2;
  warnCMP0063._M_string_length = 0;
  warnCMP0063.field_2._M_local_buf[0] = '\0';
  target_local = target;
  local_270 = flags;
  TVar3 = cmGeneratorTarget::GetType(target);
  if (((TVar3 == SHARED_LIBRARY) ||
      (TVar3 = cmGeneratorTarget::GetType(target_local), TVar3 == MODULE_LIBRARY)) ||
     (bVar2 = cmGeneratorTarget::IsExecutableWithExports(target_local), bVar2)) {
LAB_002e96b9:
    psVar9 = (string *)0x0;
  }
  else {
    PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0063(target_local);
    if (PVar4 == OLD) goto LAB_002e9b7a;
    if (PVar4 != WARN) goto LAB_002e96b9;
    psVar9 = &warnCMP0063;
  }
  pcVar1 = target_local;
  std::__cxx11::string::string((string *)&l,(string *)lang);
  std::operator+(&option,"CMAKE_",&l);
  std::operator+(&compileOption,&option,"_COMPILE_OPTIONS_VISIBILITY");
  std::__cxx11::string::~string((string *)&option);
  pcVar6 = cmMakefile::GetDefinition(this->Makefile,&compileOption);
  if (pcVar6 != (char *)0x0) {
    std::operator+(&flagDefine,&l,"_VISIBILITY_PRESET");
    __s1 = cmGeneratorTarget::GetProperty(pcVar1,&flagDefine);
    if (__s1 != (char *)0x0) {
      if (psVar9 == (string *)0x0) {
        iVar5 = strcmp(__s1,"hidden");
        if (((iVar5 != 0) && (iVar5 = strcmp(__s1,"default"), iVar5 != 0)) &&
           ((iVar5 = strcmp(__s1,"protected"), iVar5 != 0 &&
            (iVar5 = strcmp(__s1,"internal"), iVar5 != 0)))) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&option);
          poVar8 = std::operator<<((ostream *)&option,"Target ");
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar1);
          poVar8 = std::operator<<(poVar8,(string *)psVar7);
          poVar8 = std::operator<<(poVar8," uses unsupported value \"");
          poVar8 = std::operator<<(poVar8,__s1);
          poVar8 = std::operator<<(poVar8,"\" for ");
          poVar8 = std::operator<<(poVar8,(string *)&flagDefine);
          std::operator<<(poVar8,".");
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(local_268._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&option);
          goto LAB_002e992a;
        }
        std::__cxx11::string::string((string *)&local_268,pcVar6,&local_271);
        std::operator+(&option,&local_268,__s1);
        std::__cxx11::string::~string((string *)&local_268);
        (*this->_vptr_cmLocalGenerator[5])(this,local_270,&option);
        this_01 = &option;
      }
      else {
        std::operator+(&local_268,"  ",&flagDefine);
        std::operator+(&option,&local_268,"\n");
        std::__cxx11::string::append((string *)psVar9);
        std::__cxx11::string::~string((string *)&option);
        this_01 = &local_268;
      }
      std::__cxx11::string::~string((string *)this_01);
    }
LAB_002e992a:
    std::__cxx11::string::~string((string *)&flagDefine);
  }
  std::__cxx11::string::~string((string *)&compileOption);
  std::__cxx11::string::~string((string *)&l);
  bVar2 = std::operator==(lang,"CXX");
  pcVar1 = target_local;
  if (bVar2) {
    std::__cxx11::string::string
              ((string *)&option,"CMAKE_CXX_COMPILE_OPTIONS_VISIBILITY_INLINES_HIDDEN",
               (allocator *)&l);
    pcVar6 = cmMakefile::GetDefinition(this->Makefile,&option);
    if (pcVar6 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&l,"VISIBILITY_INLINES_HIDDEN",(allocator *)&compileOption);
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&l);
      std::__cxx11::string::~string((string *)&l);
      if (bVar2) {
        if (psVar9 == (string *)0x0) {
          (*this->_vptr_cmLocalGenerator[6])(this,local_270,pcVar6);
        }
        else {
          std::__cxx11::string::append((char *)psVar9);
        }
      }
    }
    std::__cxx11::string::~string((string *)&option);
  }
  if ((warnCMP0063._M_string_length != 0) &&
     (pVar11 = std::
               _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
               ::_M_insert_unique<cmGeneratorTarget_const*const&>
                         ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                           *)&this->WarnCMP0063,&target_local),
     ((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&option);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&l,(cmPolicies *)0x3f,id);
    poVar8 = std::operator<<((ostream *)&option,(string *)&l);
    poVar8 = std::operator<<(poVar8,"\nTarget \"");
    psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(target_local);
    poVar8 = std::operator<<(poVar8,(string *)psVar9);
    poVar8 = std::operator<<(poVar8,"\" of type \"");
    TVar3 = cmGeneratorTarget::GetType(target_local);
    pcVar6 = cmState::GetTargetTypeName(TVar3);
    poVar8 = std::operator<<(poVar8,pcVar6);
    poVar8 = std::operator<<(poVar8,"\" has the following visibility properties set for ");
    poVar8 = std::operator<<(poVar8,(string *)lang);
    poVar8 = std::operator<<(poVar8,":\n");
    poVar8 = std::operator<<(poVar8,(string *)&warnCMP0063);
    std::operator<<(poVar8,"For compatibility CMake is not honoring them for this target.");
    std::__cxx11::string::~string((string *)&l);
    pcVar10 = cmGeneratorTarget::GetLocalGenerator(target_local);
    this_00 = pcVar10->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace((cmListFileBacktrace *)&l,target_local);
    cmake::IssueMessage(this_00,AUTHOR_WARNING,&compileOption,(cmListFileBacktrace *)&l,false);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&l);
    std::__cxx11::string::~string((string *)&compileOption);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&option);
  }
LAB_002e9b7a:
  std::__cxx11::string::~string((string *)&warnCMP0063);
  return;
}

Assistant:

void cmLocalGenerator
::AddVisibilityPresetFlags(std::string &flags, cmGeneratorTarget const* target,
                            const std::string& lang)
{
  if (lang.empty())
    {
    return;
    }

  std::string warnCMP0063;
  std::string *pWarnCMP0063 = 0;
  if (target->GetType() != cmState::SHARED_LIBRARY &&
      target->GetType() != cmState::MODULE_LIBRARY &&
      !target->IsExecutableWithExports())
    {
    switch (target->GetPolicyStatusCMP0063())
      {
      case cmPolicies::OLD:
        return;
      case cmPolicies::WARN:
        pWarnCMP0063 = &warnCMP0063;
        break;
      default:
        break;
      }
    }

  AddVisibilityCompileOption(flags, target, this, lang, pWarnCMP0063);

  if(lang == "CXX")
    {
    AddInlineVisibilityCompileOption(flags, target, this, pWarnCMP0063);
    }

  if (!warnCMP0063.empty() &&
      this->WarnCMP0063.insert(target).second)
    {
    std::ostringstream w;
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0063) << "\n"
      "Target \"" << target->GetName() << "\" of "
      "type \"" << cmState::GetTargetTypeName(target->GetType()) << "\" "
      "has the following visibility properties set for " << lang << ":\n" <<
      warnCMP0063 <<
      "For compatibility CMake is not honoring them for this target.";
    target->GetLocalGenerator()->GetCMakeInstance()
      ->IssueMessage(cmake::AUTHOR_WARNING, w.str(),
                     target->GetBacktrace());
    }
}